

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

void __thiscall CNetTokenCache::Update(CNetTokenCache *this)

{
  long lVar1;
  CConnlessPacketInfo *pCVar2;
  int64 iVar3;
  void *pvVar4;
  int64 iVar5;
  CConnlessPacketInfo *pCVar6;
  
  iVar3 = time_get();
  while ((pvVar4 = CRingBufferBase::First((CRingBufferBase *)this), pvVar4 != (void *)0x0 &&
         (*(long *)((long)pvVar4 + 0x20) <= iVar3))) {
    CRingBufferBase::PopFirst((CRingBufferBase *)this);
  }
  for (pCVar6 = this->m_pConnlessPacketList; pCVar6 != (CConnlessPacketInfo *)0x0;
      pCVar6 = pCVar6->m_pNext) {
    lVar1 = pCVar6->m_LastTokenRequest;
    iVar5 = time_freq();
    if (lVar1 + iVar5 * 2 <= iVar3) {
      FetchToken(this,&pCVar6->m_Addr);
      pCVar6->m_LastTokenRequest = iVar3;
    }
  }
  pCVar6 = this->m_pConnlessPacketList;
  while ((pCVar6 != (CConnlessPacketInfo *)0x0 && (pCVar6->m_Expiry <= iVar3))) {
    pCVar2 = pCVar6->m_pNext;
    operator_delete(pCVar6,0x5c0);
    this->m_pConnlessPacketList = pCVar2;
    pCVar6 = pCVar2;
  }
  return;
}

Assistant:

void CNetTokenCache::Update()
{
	int64 Now = time_get();

	// drop expired address info
	CAddressInfo *pAddrInfo;
	while((pAddrInfo = m_TokenCache.First()) && (pAddrInfo->m_Expiry <= Now))
		m_TokenCache.PopFirst();

	// try to fetch the token again for stored packets
	CConnlessPacketInfo * pEntry = m_pConnlessPacketList;
	while(pEntry)
	{
		if(pEntry->m_LastTokenRequest + 2*time_freq() <= Now)
		{
			FetchToken(&pEntry->m_Addr);
			pEntry->m_LastTokenRequest = Now;
		}
		pEntry = pEntry->m_pNext;
	}

	// drop expired packets
	while(m_pConnlessPacketList && m_pConnlessPacketList->m_Expiry <= Now)
	{
		CConnlessPacketInfo *pNewList = m_pConnlessPacketList->m_pNext;
		delete m_pConnlessPacketList;
		m_pConnlessPacketList = pNewList;
	}
}